

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O2

bool __thiscall QMYSQLResult::reset(QMYSQLResult *this,QString *query)

{
  QList<QMYSQLResultPrivate::QMyField> *this_00;
  QMYSQLResultPrivate *this_01;
  char cVar1;
  undefined1 uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  long *plVar6;
  QMYSQLDriverPrivate *pQVar7;
  MYSQL_RES *pMVar8;
  QMetaType QVar9;
  pointer pQVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_78;
  QSqlError local_60 [8];
  QArrayDataPointer<char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QMYSQLResultPrivate **)&this->field_0x8;
  lVar5 = QSqlResult::driver();
  if (lVar5 != 0) {
    plVar6 = (long *)QSqlResult::driver();
    cVar1 = (**(code **)(*plVar6 + 0x60))(plVar6);
    if (cVar1 != '\0') {
      QSqlResult::driver();
      cVar1 = QSqlDriver::isOpenError();
      if (cVar1 == '\0') {
        this_01->preparedQuery = false;
        cleanup(this,(EVP_PKEY_CTX *)query);
        local_58.size = -0x5555555555555556;
        local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_58.ptr = (char *)0xaaaaaaaaaaaaaaaa;
        QString::toUtf8_helper((QString *)&local_58);
        pQVar7 = QMYSQLResultPrivate::drv_d_func(this_01);
        pcVar11 = local_58.ptr;
        if (local_58.ptr == (char *)0x0) {
          pcVar11 = (char *)&QByteArray::_empty;
        }
        iVar3 = mysql_real_query(pQVar7->mysql,pcVar11,local_58.size);
        if (iVar3 == 0) {
          pQVar7 = QMYSQLResultPrivate::drv_d_func(this_01);
          pMVar8 = (MYSQL_RES *)mysql_store_result(pQVar7->mysql);
          this_01->result = pMVar8;
          if (pMVar8 == (MYSQL_RES *)0x0) {
            pQVar7 = QMYSQLResultPrivate::drv_d_func(this_01);
            iVar3 = mysql_field_count(pQVar7->mysql);
            if (iVar3 != 0) {
              pcVar11 = "Unable to store result";
              goto LAB_0010a416;
            }
          }
          pQVar7 = QMYSQLResultPrivate::drv_d_func(this_01);
          uVar4 = mysql_field_count(pQVar7->mysql);
          (**(code **)(*(long *)this + 0x38))(this,uVar4 != 0);
          this_00 = &this_01->fields;
          QList<QMYSQLResultPrivate::QMyField>::resize(this_00,(long)(int)uVar4);
          pQVar7 = QMYSQLResultPrivate::drv_d_func(this_01);
          iVar3 = mysql_affected_rows(pQVar7->mysql);
          this_01->rowsAffected = iVar3;
          cVar1 = QSqlResult::isSelect();
          if (cVar1 != '\0') {
            uVar13 = 0;
            uVar14 = (ulong)uVar4;
            if ((int)uVar4 < 1) {
              uVar14 = uVar13;
            }
            for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
              lVar5 = mysql_fetch_field_direct(this_01->result,uVar12 & 0xffffffff);
              QVar9 = qDecodeMYSQLType(*(enum_field_types *)(lVar5 + 0x70),*(uint *)(lVar5 + 100));
              pQVar10 = QList<QMYSQLResultPrivate::QMyField>::data(this_00);
              *(QMetaTypeInterface **)((long)&(pQVar10->type).d_ptr + uVar13) = QVar9.d_ptr;
              pQVar10 = QList<QMYSQLResultPrivate::QMyField>::data(this_00);
              *(long *)((long)&pQVar10->myField + uVar13) = lVar5;
              uVar13 = uVar13 + 0x28;
            }
            (**(code **)(*(long *)this + 0x18))(this,0xffffffffffffffff);
          }
          (**(code **)(*(long *)this + 0x20))(this,1);
          uVar2 = QSqlResult::isActive();
        }
        else {
          pcVar11 = "Unable to execute query";
LAB_0010a416:
          uVar2 = 0;
          QCoreApplication::translate((char *)&local_78,"QMYSQLResult",pcVar11,0);
          QMYSQLResultPrivate::drv_d_func(this_01);
          qMakeError((QString *)local_60,(ErrorType)&local_78,(QMYSQLDriverPrivate *)0x2);
          (**(code **)(*(long *)this + 0x28))(this,local_60);
          QSqlError::~QSqlError(local_60);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        }
        QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
        goto LAB_0010a37a;
      }
    }
  }
  uVar2 = 0;
LAB_0010a37a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QMYSQLResult::reset (const QString& query)
{
    Q_D(QMYSQLResult);
    if (!driver() || !driver()->isOpen() || driver()->isOpenError())
        return false;

    d->preparedQuery = false;

    cleanup();

    const QByteArray encQuery = query.toUtf8();
    if (mysql_real_query(d->drv_d_func()->mysql, encQuery.data(), encQuery.size())) {
        setLastError(qMakeError(QCoreApplication::translate("QMYSQLResult", "Unable to execute query"),
                     QSqlError::StatementError, d->drv_d_func()));
        return false;
    }
    d->result = mysql_store_result(d->drv_d_func()->mysql);
    if (!d->result && mysql_field_count(d->drv_d_func()->mysql) > 0) {
        setLastError(qMakeError(QCoreApplication::translate("QMYSQLResult", "Unable to store result"),
                    QSqlError::StatementError, d->drv_d_func()));
        return false;
    }
    int numFields = mysql_field_count(d->drv_d_func()->mysql);
    setSelect(numFields != 0);
    d->fields.resize(numFields);
    d->rowsAffected = mysql_affected_rows(d->drv_d_func()->mysql);

    if (isSelect()) {
        for(int i = 0; i < numFields; i++) {
            MYSQL_FIELD* field = mysql_fetch_field_direct(d->result, i);
            d->fields[i].type = qDecodeMYSQLType(field->type, field->flags);
            d->fields[i].myField = field;
        }
        setAt(QSql::BeforeFirstRow);
    }
    setActive(true);
    return isActive();
}